

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genrand.c
# Opt level: O2

unsigned_long genrand_int32(void)

{
  ulong uVar1;
  unsigned_long uVar2;
  long lVar3;
  
  if ((long)mti < 0x270) {
    uVar2 = mt[mti];
    mti = mti + 1;
  }
  else {
    if (mti == 0x271) {
      init_genrand(0x1571);
    }
    for (lVar3 = 0; lVar3 != 0xe3; lVar3 = lVar3 + 1) {
      mt[lVar3] = genrand_int32::mag01[(uint)mt[lVar3 + 1] & 1] ^ mt[lVar3 + 0x18d] ^
                  (ulong)(((uint)mt[lVar3 + 1] & 0x7ffffffe | (uint)mt[lVar3] & 0x80000000) >> 1);
    }
    for (lVar3 = 0; lVar3 != 0x18c; lVar3 = lVar3 + 1) {
      mt[lVar3 + 0xe3] =
           genrand_int32::mag01[(uint)mt[lVar3 + 0xe4] & 1] ^ mt[lVar3] ^
           (ulong)(((uint)mt[lVar3 + 0xe4] & 0x7ffffffe | (uint)mt[lVar3 + 0xe3] & 0x80000000) >> 1)
      ;
    }
    mt[0x26f] = genrand_int32::mag01[(uint)mt[0] & 1] ^ mt[0x18c] ^
                (ulong)(((uint)mt[0] & 0x7ffffffe | (uint)mt[0x26f] & 0x80000000) >> 1);
    mti = 1;
    uVar2 = mt[0];
  }
  uVar1 = uVar2 >> 0xb ^ uVar2;
  uVar1 = ((uint)uVar1 & 0x13a58ad) << 7 ^ uVar1;
  uVar1 = ((uint)uVar1 & 0x1df8c) << 0xf ^ uVar1;
  return uVar1 >> 0x12 ^ uVar1;
}

Assistant:

unsigned long
genrand_int32(void)
{
    unsigned long y;
    static unsigned long mag01[2] = { 0x0UL, MATRIX_A };
    /* mag01[x] = x * MATRIX_A  for x=0,1 */

    if (mti >= N) {             /* generate N words at one time */
        int kk;

        if (mti == N + 1)       /* if init_genrand() has not been called, */
            init_genrand(5489UL);       /* a default initial seed is used */

        for (kk = 0; kk < N - M; kk++) {
            y = (mt[kk] & UPPER_MASK) | (mt[kk + 1] & LOWER_MASK);
            mt[kk] = mt[kk + M] ^ (y >> 1) ^ mag01[y & 0x1UL];
        }
        for (; kk < N - 1; kk++) {
            y = (mt[kk] & UPPER_MASK) | (mt[kk + 1] & LOWER_MASK);
            mt[kk] = mt[kk + (M - N)] ^ (y >> 1) ^ mag01[y & 0x1UL];
        }
        y = (mt[N - 1] & UPPER_MASK) | (mt[0] & LOWER_MASK);
        mt[N - 1] = mt[M - 1] ^ (y >> 1) ^ mag01[y & 0x1UL];

        mti = 0;
    }

    y = mt[mti++];

    /* Tempering */
    y ^= (y >> 11);
    y ^= (y << 7) & 0x9d2c5680UL;
    y ^= (y << 15) & 0xefc60000UL;
    y ^= (y >> 18);

    return y;
}